

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O3

GLuint gl4cts::StencilTexturing::Utils::createAndFill2DTexture
                 (Context *context,GLuint width,GLuint height,GLenum internal_format,GLenum format,
                 GLenum type,GLvoid *data)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  GLuint id;
  undefined8 local_38;
  long lVar3;
  
  local_38 = CONCAT44(in_register_00000084,format);
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  id = 0;
  (**(code **)(lVar3 + 0x6f8))(1,&id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x112);
  (**(code **)(lVar3 + 0xb8))(0xde1,id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x117);
  (**(code **)(lVar3 + 0x1310))(0xde1,0,internal_format,width,height,0,local_38,type,data);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x11a);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x813c,0);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x813d,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"TexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x11e);
  (**(code **)(lVar3 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x121);
  return id;
}

Assistant:

GLuint Utils::createAndFill2DTexture(deqp::Context& context, GLuint width, GLuint height, GLenum internal_format,
									 GLenum format, GLenum type, const GLvoid* data)
{
	const Functions& gl = context.getRenderContext().getFunctions();
	GLuint			 id = 0;

	gl.genTextures(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	try
	{
		gl.bindTexture(GL_TEXTURE_2D, id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, internal_format, width, height, 0 /* border */, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
	catch (std::exception& exc)
	{
		gl.deleteTextures(1, &id);
		id = 0;

		throw exc;
	}

	return id;
}